

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O2

void __thiscall ConfigReader::error(ConfigReader *this,string *errstr)

{
  ostream *poVar1;
  string sStack_1b8;
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_188,"Line ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," : ");
  std::operator<<(poVar1,(string *)errstr);
  std::__cxx11::stringbuf::str();
  doLog(8,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void ConfigReader::error(const std::string &errstr)
{
    std::stringstream ss;
    ss << "Line " << m_lineNum << " : " << errstr; 
    doLog(LOG_ERROR, ss.str());
}